

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::handleVariable
          (TParseContext *this,TSourceLoc *loc,TSymbol *symbol,TString *string)

{
  TLayoutGeometry TVar1;
  TIntermediate *pTVar2;
  TSymbolTable *this_00;
  pointer pcVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar8;
  undefined4 extraout_var_04;
  long *plVar9;
  TVariable *this_01;
  TIntermSymbol *pTVar10;
  TIntermConstantUnion *index;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TPoolAllocator *pTVar11;
  TString *name;
  TString *mangledName;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar12;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *pcVar13;
  bool builtIn;
  TVector<const_glslang::TFunction_*> candidateList;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> __str;
  bool local_f9;
  TSymbol *local_f8;
  TString *local_f0;
  TVector<const_glslang::TFunction_*> local_e8;
  undefined1 local_c8 [24];
  char local_b0 [128];
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  
  local_f8 = symbol;
  local_f0 = string;
  if ((symbol != (TSymbol *)0x0) && (iVar5 = (*symbol->_vptr_TSymbol[0x11])(symbol), iVar5 != 0)) {
    uVar6 = (*local_f8->_vptr_TSymbol[0x11])();
    iVar5 = (*local_f8->_vptr_TSymbol[0x12])();
    (*local_f8->_vptr_TSymbol[3])();
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,(ulong)uVar6,CONCAT44(extraout_var,iVar5));
  }
  if ((local_f8 != (TSymbol *)0x0) &&
     (iVar5 = (*local_f8->_vptr_TSymbol[0x14])(), (char)iVar5 != '\0')) {
    iVar5 = (*local_f8->_vptr_TSymbol[0xc])();
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x180))
                      ((long *)CONCAT44(extraout_var_00,iVar5));
    if (cVar4 == '\0') {
      iVar5 = (*local_f8->_vptr_TSymbol[0xc])();
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x1a8))
                        ((long *)CONCAT44(extraout_var_01,iVar5));
      if (cVar4 == '\0') {
        iVar5 = (*local_f8->_vptr_TSymbol[0xb])();
        if (CONCAT44(extraout_var_02,iVar5) != 0) {
          iVar5 = (*local_f8->_vptr_TSymbol[0xb])();
          plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0xb0))
                                     ((long *)CONCAT44(extraout_var_03,iVar5));
          plVar8 = (long *)(**(code **)(*plVar8 + 0x60))(plVar8);
          cVar4 = (**(code **)(*plVar8 + 0x1a8))(plVar8);
          if (cVar4 != '\0') goto LAB_004a52ea;
        }
      }
      else {
LAB_004a52ea:
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4e])
                  (this,&local_f8);
      }
    }
  }
  if (local_f8 == (TSymbol *)0x0) {
    plVar8 = (long *)0x0;
  }
  else {
    iVar5 = (*local_f8->_vptr_TSymbol[0xb])();
    plVar8 = (long *)CONCAT44(extraout_var_04,iVar5);
  }
  if (plVar8 != (long *)0x0) {
    plVar9 = (long *)(**(code **)(*plVar8 + 0xb0))(plVar8);
    this_01 = (TVariable *)(**(code **)(*plVar9 + 0x50))(plVar9);
    pTVar10 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,this_01,
                         loc);
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    uVar6 = (**(code **)(*plVar8 + 0xb8))(plVar8);
    index = TIntermediate::addConstantUnion(pTVar2,uVar6,loc,false);
    pTVar10 = (TIntermSymbol *)
              TIntermediate::addIndex
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         EOpIndexDirectStruct,&pTVar10->super_TIntermTyped,
                         &index->super_TIntermTyped,loc);
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    plVar9 = (long *)CONCAT44(extraout_var_05,iVar5);
    cVar4 = (**(code **)(*plVar9 + 0x128))(plVar9);
    if (cVar4 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    lVar12 = plVar9[0xd];
    uVar6 = (**(code **)(*plVar8 + 0xb8))(plVar8);
    (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar10,*(undefined8 *)(*(long *)(lVar12 + 8) + (ulong)uVar6 * 0x20));
    iVar5 = (*(pTVar10->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar10);
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar5) + 0x18))
                      ((long *)CONCAT44(extraout_var_06,iVar5));
    if (cVar4 != '\0') {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"member of nameless block was not redeclared",(local_f0->_M_dataplus)._M_p
                 ,"");
    }
    goto LAB_004a5717;
  }
  if (local_f8 == (TSymbol *)0x0) {
    this_01 = (TVariable *)0x0;
  }
  else {
    iVar5 = (*local_f8->_vptr_TSymbol[9])();
    this_01 = (TVariable *)CONCAT44(extraout_var_07,iVar5);
  }
  if (this_01 == (TVariable *)0x0) {
    if (local_f8 != (TSymbol *)0x0) {
      pcVar13 = "variable name expected";
      goto LAB_004a551b;
    }
    this_01 = (TVariable *)0x0;
  }
  else {
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x180))
                      ((long *)CONCAT44(extraout_var_08,iVar5));
    if (cVar4 != '\0') {
      this_01 = (TVariable *)0x0;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot be used (maybe an instance name is needed)",
                 (local_f0->_M_dataplus)._M_p);
    }
    if ((this_01 != (TVariable *)0x0) &&
       ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh)) {
      TVar1 = ((this->super_TParseContextBase).super_TParseVersions.intermediate)->outputPrimitive;
      iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])(this_01);
      iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_09,iVar5),"gl_PrimitiveTriangleIndicesEXT");
      pcVar13 = "cannot be used (output primitive type mismatch)";
      if ((TVar1 == ElgTriangles) || (iVar5 != 0)) {
        iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])(this_01);
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_10,iVar5),"gl_PrimitiveLineIndicesEXT");
        if ((TVar1 == ElgLines) || (iVar5 != 0)) {
          iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[6])(this_01);
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_11,iVar5),"gl_PrimitivePointIndicesEXT");
          if ((TVar1 == ElgPoints) || (iVar5 != 0)) goto LAB_004a5548;
        }
      }
LAB_004a551b:
      this_01 = (TVariable *)0x0;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,pcVar13,(local_f0->_M_dataplus)._M_p);
    }
  }
LAB_004a5548:
  if (this_01 == (TVariable *)0x0) {
    local_f9 = false;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>.
    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (this->super_TParseContextBase).symbolTable;
    local_c8._0_8_ = GetThreadPoolAllocator();
    pcVar3 = (local_f0->_M_dataplus)._M_p;
    local_c8._8_8_ = local_b0;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        local_c8,pcVar3,pcVar3 + local_f0->_M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               local_c8,"(");
    TSymbolTable::findFunctionNameList
              (this_00,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )local_c8,&local_e8,&local_f9);
    if ((local_e8.
         super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         .
         super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         local_e8.
         super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         .
         super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) || (local_f9 != false)) {
      pTVar11 = GetThreadPoolAllocator();
      this_01 = (TVariable *)TPoolAllocator::allocate(pTVar11,0xf8);
      TType::TType((TType *)local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      mangledName = local_f0;
      name = local_f0;
    }
    else {
      pTVar11 = GetThreadPoolAllocator();
      this_01 = (TVariable *)TPoolAllocator::allocate(pTVar11,0xf8);
      iVar5 = (*((*local_e8.
                   super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   .
                   super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[3])();
      name = (TString *)CONCAT44(extraout_var_12,iVar5);
      iVar5 = (*((*local_e8.
                   super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   .
                   super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TSymbol)._vptr_TSymbol[6])();
      mangledName = (TString *)CONCAT44(extraout_var_13,iVar5);
      TType::TType((TType *)local_c8,EbtFunction,EvqTemporary,1,0,0,false);
    }
    TVariable::TVariable(this_01,name,mangledName,(TType *)local_c8,false);
  }
  iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar5) + 0x58))
                     ((long *)CONCAT44(extraout_var_14,iVar5));
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  if ((*(ulong *)(lVar12 + 8) & 0x10000007f) == 2) {
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0x17])(this_01);
    iVar7 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    pTVar10 = (TIntermSymbol *)
              TIntermediate::addConstantUnion
                        (pTVar2,(TConstUnionArray *)CONCAT44(extraout_var_15,iVar5),
                         (TType *)CONCAT44(extraout_var_16,iVar7),loc,false);
  }
  else {
    pTVar10 = TIntermediate::addSymbol(pTVar2,this_01,loc);
  }
LAB_004a5717:
  iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar5) + 0x58))
                     ((long *)CONCAT44(extraout_var_17,iVar5));
  uVar6 = *(uint *)(lVar12 + 8) & 0x7f;
  if ((uVar6 - 0x14 < 0xb) || (uVar6 - 3 < 4)) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
    ::
    _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
              ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                *)&((this->super_TParseContextBase).super_TParseVersions.intermediate)->ioAccessed,
               local_f0);
  }
  iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar5) + 0x38))
                    ((long *)CONCAT44(extraout_var_18,iVar5));
  if (iVar5 == 0x12) {
    iVar5 = (*(this_01->super_TSymbol)._vptr_TSymbol[0xc])(this_01);
    lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar5) + 0x58))
                       ((long *)CONCAT44(extraout_var_19,iVar5));
    if ((*(ushort *)(lVar12 + 0xe) & 0x2f2) != 0) {
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar2->useVulkanMemoryModel = true;
      TProcesses::addProcess(&pTVar2->processes,"use-vulkan-memory-model");
    }
  }
  return &pTVar10->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleVariable(const TSourceLoc& loc, TSymbol* symbol, const TString* string)
{
    TIntermTyped* node = nullptr;

    // Error check for requiring specific extensions present.
    if (symbol && symbol->getNumExtensions())
        requireExtensions(loc, symbol->getNumExtensions(), symbol->getExtensions(), symbol->getName().c_str());

    if (symbol && symbol->isReadOnly()) {
        // All shared things containing an unsized array must be copied up
        // on first use, so that all future references will share its array structure,
        // so that editing the implicit size will effect all nodes consuming it,
        // and so that editing the implicit size won't change the shared one.
        //
        // If this is a variable or a block, check it and all it contains, but if this
        // is a member of an anonymous block, check the whole block, as the whole block
        // will need to be copied up if it contains an unsized array.
        //
        // This check is being done before the block-name check further down, so guard
        // for that too.
        if (!symbol->getType().isUnusableName()) {
            if (symbol->getType().containsUnsizedArray() ||
                (symbol->getAsAnonMember() &&
                 symbol->getAsAnonMember()->getAnonContainer().getType().containsUnsizedArray()))
                makeEditable(symbol);
        }
    }

    const TVariable* variable;
    const TAnonMember* anon = symbol ? symbol->getAsAnonMember() : nullptr;
    if (anon) {
        // It was a member of an anonymous container.

        // Create a subtree for its dereference.
        variable = anon->getAnonContainer().getAsVariable();
        TIntermTyped* container = intermediate.addSymbol(*variable, loc);
        TIntermTyped* constNode = intermediate.addConstantUnion(anon->getMemberNumber(), loc);
        node = intermediate.addIndex(EOpIndexDirectStruct, container, constNode, loc);

        node->setType(*(*variable->getType().getStruct())[anon->getMemberNumber()].type);
        if (node->getType().hiddenMember())
            error(loc, "member of nameless block was not redeclared", string->c_str(), "");
    } else {
        // Not a member of an anonymous container.

        // The symbol table search was done in the lexical phase.
        // See if it was a variable.
        variable = symbol ? symbol->getAsVariable() : nullptr;
        if (variable) {
            if (variable->getType().isUnusableName()) {
                error(loc, "cannot be used (maybe an instance name is needed)", string->c_str(), "");
                variable = nullptr;
            }

            if (language == EShLangMesh && variable) {
                TLayoutGeometry primitiveType = intermediate.getOutputPrimitive();
                if ((variable->getMangledName() == "gl_PrimitiveTriangleIndicesEXT" && primitiveType != ElgTriangles) ||
                    (variable->getMangledName() == "gl_PrimitiveLineIndicesEXT" && primitiveType != ElgLines) ||
                    (variable->getMangledName() == "gl_PrimitivePointIndicesEXT" && primitiveType != ElgPoints)) {
                    error(loc, "cannot be used (output primitive type mismatch)", string->c_str(), "");
                    variable = nullptr;
                }
            }
        } else {
            if (symbol)
                error(loc, "variable name expected", string->c_str(), "");
        }

        // Recovery, if it wasn't found or was not a variable.
        if (! variable) {
            bool builtIn = false;
            TVector<const TFunction*> candidateList;
            symbolTable.findFunctionNameList(*string + "(", candidateList, builtIn);

            // If it's a function, pass the name/mangledName
            if (!candidateList.empty() && !builtIn) {
                variable = new TVariable(&candidateList[0]->getName(), &candidateList[0]->getMangledName(), TType(EbtFunction));
            } else {
                variable = new TVariable(string, TType(EbtVoid));
            }
        }

        if (variable->getType().getQualifier().isFrontEndConstant())
            node = intermediate.addConstantUnion(variable->getConstArray(), variable->getType(), loc);
        else
            node = intermediate.addSymbol(*variable, loc);
    }

    if (variable->getType().getQualifier().isIo())
        intermediate.addIoAccessed(*string);

    if (variable->getType().isReference() &&
        variable->getType().getQualifier().bufferReferenceNeedsVulkanMemoryModel()) {
        intermediate.setUseVulkanMemoryModel();
    }

    return node;
}